

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int steedintrap(trap *trap,obj *otmp)

{
  permonst *ppVar1;
  monst *mon;
  byte bVar2;
  boolean bVar3;
  int d_override;
  int iVar4;
  char *pcVar5;
  char *line;
  bool bVar6;
  
  mon = u.usteed;
  iVar4 = 0;
  if (trap == (trap *)0x0 || u.usteed == (monst *)0x0) {
    return 0;
  }
  ppVar1 = (u.usteed)->data;
  bVar2 = trap->field_0x8 & 0x1f;
  (u.usteed)->mx = u.ux;
  mon->my = u.uy;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_002537d8;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_002537d3;
    bVar6 = false;
  }
  else {
LAB_002537d3:
    if (ublindf == (obj *)0x0) {
      bVar6 = true;
    }
    else {
LAB_002537d8:
      bVar6 = ublindf->oartifact != '\x1d';
    }
  }
  switch(bVar2) {
  case 1:
    if (otmp == (obj *)0x0) {
      impossible("steed hit by non-existant arrow?");
      return 0;
    }
    iVar4 = 8;
    goto LAB_002538c1;
  case 2:
    goto switchD_0025381d_caseD_2;
  case 3:
  case 4:
  case 5:
  case 7:
  case 9:
  case 10:
    goto switchD_0025381d_caseD_3;
  case 6:
    iVar4 = 0x10;
LAB_002538cc:
    d_override = rnd(iVar4);
    iVar4 = 0;
    otmp = (obj *)0x0;
    goto LAB_002538da;
  case 8:
    if ((mon->mintrinsics & 4) != 0) {
      return 1;
    }
    if ((ppVar1->mflags1 & 0x400) != 0) {
      return 1;
    }
    if ((*(uint *)&mon->field_0x60 & 0xc0000) != 0x40000) {
      return 1;
    }
    *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xfff3ffff;
    iVar4 = rnd(0x19);
    mon->mfrozen = (uchar)iVar4;
    if (bVar6) {
      return 1;
    }
    pcVar5 = Monnam(mon);
    line = "%s suddenly falls asleep!";
LAB_00253973:
    pline(line,pcVar5);
    return 1;
  case 0xb:
  case 0xc:
    if (0 < mon->mhp) {
      iVar4 = (uint)(bVar2 != 0xb) * 4 + 6;
      goto LAB_002538cc;
    }
    goto LAB_002538e6;
  default:
    if (bVar2 == 0x17) {
      bVar3 = resists_magm(mon);
      if (bVar3 != '\0') {
        return 0;
      }
      iVar4 = resist(mon,'\v',0,0);
      if (iVar4 != 0) {
        return 1;
      }
      newcham(level,mon,(permonst *)0x0,'\0','\0');
      bVar3 = can_saddle(mon);
      if ((bVar3 == '\0') || (bVar3 = can_ride(mon), bVar3 == '\0')) {
        dismount_steed(3);
        return 1;
      }
      pcVar5 = x_monnam(mon,(uint)(mon->mnamelth == '\0') * 2,(char *)0x0,8,'\0');
      line = "You have to adjust yourself in the saddle on %s.";
      goto LAB_00253973;
    }
    if (bVar2 != 0x18) {
      return 0;
    }
switchD_0025381d_caseD_2:
    if (otmp == (obj *)0x0) {
      pcVar5 = "dart";
      if (bVar2 == 0x18) {
        pcVar5 = "shuriken";
      }
      iVar4 = 0;
      impossible("steed hit by non-existant %s?",pcVar5);
    }
    else {
      iVar4 = 7;
LAB_002538c1:
      d_override = 0;
LAB_002538da:
      bVar3 = thitm(iVar4,mon,otmp,d_override,'\0');
      if (bVar3 == '\0') {
        iVar4 = 1;
      }
      else {
LAB_002538e6:
        dismount_steed(3);
        iVar4 = 2;
      }
    }
switchD_0025381d_caseD_3:
    return iVar4;
  }
}

Assistant:

static int steedintrap(struct trap *trap, struct obj *otmp)
{
	struct monst *mtmp = u.usteed;
	const struct permonst *mptr;
	int tt;
	boolean in_sight;
	boolean trapkilled = FALSE;
	boolean steedhit = FALSE;

	if (!u.usteed || !trap) return 0;
	mptr = mtmp->data;
	tt = trap->ttyp;
	mtmp->mx = u.ux;
	mtmp->my = u.uy;

	in_sight = !Blind;
	switch (tt) {
		case ARROW_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant arrow?");
				return 0;
			}
			if (thitm(8, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case DART_TRAP:
		case SHURIKEN_TRAP:
			if (!otmp) {
				impossible("steed hit by non-existant %s?",
					   tt == SHURIKEN_TRAP ? "shuriken" : "dart");
				return 0;
			}
			if (thitm(7, mtmp, otmp, 0, FALSE)) trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case SLP_GAS_TRAP:
		    if (!resists_sleep(mtmp) && !breathless(mptr) &&
				!mtmp->msleeping && mtmp->mcanmove) {
			    mtmp->mcanmove = 0;
			    mtmp->mfrozen = rnd(25);
			    if (in_sight) {
				pline("%s suddenly falls asleep!",
				      Monnam(mtmp));
			    }
			}
			steedhit = TRUE;
			break;
		case LANDMINE:
			if (thitm(0, mtmp, NULL, rnd(16), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case PIT:
		case SPIKED_PIT:
			if (mtmp->mhp <= 0 ||
				thitm(0, mtmp, NULL,
				      rnd((tt == PIT) ? 6 : 10), FALSE))
			    trapkilled = TRUE;
			steedhit = TRUE;
			break;
		case POLY_TRAP: 
		    if (!resists_magm(mtmp)) {
			if (!resist(mtmp, WAND_CLASS, 0, NOTELL)) {
				newcham(level, mtmp, NULL,
					       FALSE, FALSE);
			if (!can_saddle(mtmp) || !can_ride(mtmp)) {
				dismount_steed(DISMOUNT_POLY);
			} else {
				pline("You have to adjust yourself in the saddle on %s.",
					x_monnam(mtmp,
					 mtmp->mnamelth ? ARTICLE_NONE : ARTICLE_A,
				 	 NULL, SUPPRESS_SADDLE, FALSE));
			}
				
		    }
		    steedhit = TRUE;
		    break;
		default:
			return 0;
	    }
	}
	if (trapkilled) {
		dismount_steed(DISMOUNT_POLY);
		return 2;
	}
	else if (steedhit) return 1;
	else return 0;
}